

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O1

bool __thiscall luna::State::CallFunction(State *this,Value *f,int arg_count,int expect_result)

{
  ValueT VVar1;
  
  VVar1 = f->type_;
  if ((VVar1 != ValueT_Closure) && (VVar1 != ValueT_CFunction)) {
    __assert_fail("f->type_ == ValueT_Closure || f->type_ == ValueT_CFunction",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/State.cpp"
                  ,0x61,"bool luna::State::CallFunction(Value *, int, int)");
  }
  if (arg_count != -1) {
    (this->stack_).top_ = f + (long)arg_count + 1;
  }
  if (VVar1 == ValueT_Closure) {
    CallClosure(this,f,expect_result);
  }
  else {
    CallCFunction(this,f,expect_result);
  }
  return VVar1 == ValueT_Closure;
}

Assistant:

bool State::CallFunction(Value *f, int arg_count, int expect_result)
    {
        assert(f->type_ == ValueT_Closure || f->type_ == ValueT_CFunction);

        // Set stack top when arg_count is fixed
        if (arg_count != EXP_VALUE_COUNT_ANY)
            stack_.top_ = f + 1 + arg_count;

        if (f->type_ == ValueT_Closure)
        {
            // We need enter next ExecuteFrame
            CallClosure(f, expect_result);
            return true;
        }
        else
        {
            CallCFunction(f, expect_result);
            return false;
        }
    }